

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManCutRange(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  undefined4 local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRange;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vLower), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_34);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
  }
  p_00 = Vec_PtrAlloc(100);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vUpper), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vUpper,local_34);
    iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2);
    if (iVar1 == 0) {
      Vec_PtrPush(p_00,pAVar2);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManCutRange( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vRange;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // collect the upper ones that are not marked
    vRange = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vRange, pObj );
    return vRange;
}